

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllypticPoint.cpp
# Opt level: O0

EllypticPoint * __thiscall
EllypticPoint::operator+
          (EllypticPoint *__return_storage_ptr__,EllypticPoint *this,EllypticPoint *other)

{
  bool bVar1;
  BigInteger local_6e8;
  BigInteger local_6c8;
  BigInteger local_6a8;
  BigInteger local_688;
  BigInteger local_668;
  BigInteger local_648;
  BigInteger local_628;
  BigInteger local_608;
  BigInteger local_5e8;
  BigInteger local_5c8;
  BigInteger local_5a8;
  BigInteger local_588;
  BigInteger local_568;
  BigInteger local_548;
  BigInteger local_528;
  BigInteger local_508;
  BigInteger local_4e8;
  BigInteger local_4c8;
  BigInteger local_4a8;
  BigInteger local_488;
  BigInteger local_468;
  BigInteger local_448;
  BigInteger local_428;
  BigInteger local_408;
  undefined1 local_3e8 [8];
  BigInteger lambda_1;
  BigInteger local_3a8;
  BigInteger local_388;
  BigInteger local_368;
  BigInteger local_348;
  BigInteger local_328;
  BigInteger local_308;
  BigInteger local_2e8;
  BigInteger local_2c8;
  BigInteger local_2a8;
  BigInteger local_288;
  BigInteger local_268;
  BigInteger local_248;
  BigInteger local_228;
  BigInteger local_208;
  BigInteger local_1e8;
  BigInteger local_1c8;
  BigInteger local_1a8;
  BigInteger local_188;
  BigInteger local_168;
  BigInteger local_148;
  undefined1 local_128 [8];
  BigInteger lambda;
  Algorithms algorithms;
  BigInteger y3;
  BigInteger x3;
  BigInteger y2;
  BigInteger x2;
  undefined1 local_60 [8];
  BigInteger y1;
  BigInteger x1;
  EllypticPoint *other_local;
  EllypticPoint *this_local;
  
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&y1.isNegative,&this->x);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_60,&this->y);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&y2.isNegative,&other->x);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&x3.isNegative,&other->y);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&y3.isNegative,0);
  BigIntegerLibrary::BigInteger::BigInteger
            ((BigInteger *)
             &algorithms.listOfPrimeDivisors.
              super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  lambda.isNegative = false;
  lambda._25_7_ = 0;
  algorithms.listOfPrimeDivisors.
  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  algorithms.listOfPrimeDivisors.
  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Algorithms::Algorithms((Algorithms *)&lambda.isNegative);
  bVar1 = BigIntegerLibrary::BigInteger::operator!=
                    ((BigInteger *)&y1.isNegative,(BigInteger *)&y2.isNegative);
  if ((bVar1) &&
     (bVar1 = BigIntegerLibrary::BigInteger::operator!=
                        ((BigInteger *)local_60,(BigInteger *)&x3.isNegative), bVar1)) {
    BigIntegerLibrary::BigInteger::operator-
              (&local_1a8,(BigInteger *)&x3.isNegative,(BigInteger *)local_60);
    BigIntegerLibrary::BigInteger::operator+(&local_188,&local_1a8,&this->p);
    BigIntegerLibrary::BigInteger::operator%(&local_168,&local_188,&this->p);
    BigIntegerLibrary::BigInteger::operator-
              (&local_228,(BigInteger *)&y2.isNegative,(BigInteger *)&y1.isNegative);
    BigIntegerLibrary::BigInteger::operator+(&local_208,&local_228,&this->p);
    BigIntegerLibrary::BigInteger::operator%(&local_1e8,&local_208,&this->p);
    BigIntegerLibrary::BigInteger::BigInteger(&local_248,&this->p);
    Algorithms::inverse(&local_1c8,(Algorithms *)&lambda.isNegative,&local_1e8,&local_248);
    BigIntegerLibrary::BigInteger::operator*(&local_148,&local_168,&local_1c8);
    BigIntegerLibrary::BigInteger::operator%((BigInteger *)local_128,&local_148,&this->p);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_148);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1c8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_248);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1e8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_208);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_228);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_168);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_188);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1a8);
    BigIntegerLibrary::BigInteger::operator*
              (&local_2e8,(BigInteger *)local_128,(BigInteger *)local_128);
    BigIntegerLibrary::BigInteger::operator-(&local_2c8,&local_2e8,(BigInteger *)&y2.isNegative);
    BigIntegerLibrary::BigInteger::operator-(&local_2a8,&local_2c8,(BigInteger *)&y1.isNegative);
    BigIntegerLibrary::BigInteger::operator*(&local_308,&this->p,&this->p);
    BigIntegerLibrary::BigInteger::operator+(&local_288,&local_2a8,&local_308);
    BigIntegerLibrary::BigInteger::operator%(&local_268,&local_288,&this->p);
    BigIntegerLibrary::BigInteger::operator=((BigInteger *)&y3.isNegative,&local_268);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_268);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_288);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_308);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2a8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2c8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_2e8);
    BigIntegerLibrary::BigInteger::operator-
              (&local_3a8,(BigInteger *)&y1.isNegative,(BigInteger *)&y3.isNegative);
    BigIntegerLibrary::BigInteger::operator*(&local_388,(BigInteger *)local_128,&local_3a8);
    BigIntegerLibrary::BigInteger::operator-(&local_368,&local_388,(BigInteger *)local_60);
    BigIntegerLibrary::BigInteger::operator*((BigInteger *)&lambda_1.isNegative,&this->p,&this->p);
    BigIntegerLibrary::BigInteger::operator+
              (&local_348,&local_368,(BigInteger *)&lambda_1.isNegative);
    BigIntegerLibrary::BigInteger::operator%(&local_328,&local_348,&this->p);
    BigIntegerLibrary::BigInteger::operator=
              ((BigInteger *)
               &algorithms.listOfPrimeDivisors.
                super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_328);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_328);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_348);
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&lambda_1.isNegative);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_368);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_388);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_3a8);
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_128);
  }
  else {
    bVar1 = BigIntegerLibrary::BigInteger::operator==
                      ((BigInteger *)&y1.isNegative,(BigInteger *)&y2.isNegative);
    if ((bVar1) &&
       (bVar1 = BigIntegerLibrary::BigInteger::operator==
                          ((BigInteger *)local_60,(BigInteger *)&x3.isNegative), bVar1)) {
      BigIntegerLibrary::BigInteger::operator*
                (&local_4a8,(BigInteger *)&y1.isNegative,(BigInteger *)&y1.isNegative);
      BigIntegerLibrary::BigInteger::operator*(&local_488,&local_4a8,3);
      BigIntegerLibrary::BigInteger::operator+(&local_468,&local_488,&this->a);
      BigIntegerLibrary::BigInteger::operator*(&local_4c8,&this->p,&this->p);
      BigIntegerLibrary::BigInteger::operator+(&local_448,&local_468,&local_4c8);
      BigIntegerLibrary::BigInteger::operator%(&local_428,&local_448,&this->p);
      BigIntegerLibrary::BigInteger::operator+
                (&local_508,(BigInteger *)local_60,(BigInteger *)local_60);
      BigIntegerLibrary::BigInteger::BigInteger(&local_528,&this->p);
      Algorithms::inverse(&local_4e8,(Algorithms *)&lambda.isNegative,&local_508,&local_528);
      BigIntegerLibrary::BigInteger::operator*(&local_408,&local_428,&local_4e8);
      BigIntegerLibrary::BigInteger::operator%((BigInteger *)local_3e8,&local_408,&this->p);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_408);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_4e8);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_528);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_508);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_428);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_448);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_4c8);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_468);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_488);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_4a8);
      BigIntegerLibrary::BigInteger::operator*
                (&local_5c8,(BigInteger *)local_3e8,(BigInteger *)local_3e8);
      BigIntegerLibrary::BigInteger::operator-(&local_5a8,&local_5c8,(BigInteger *)&y2.isNegative);
      BigIntegerLibrary::BigInteger::operator-(&local_588,&local_5a8,(BigInteger *)&y1.isNegative);
      BigIntegerLibrary::BigInteger::operator*(&local_5e8,&this->p,&this->p);
      BigIntegerLibrary::BigInteger::operator+(&local_568,&local_588,&local_5e8);
      BigIntegerLibrary::BigInteger::operator%(&local_548,&local_568,&this->p);
      BigIntegerLibrary::BigInteger::operator=((BigInteger *)&y3.isNegative,&local_548);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_548);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_568);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_5e8);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_588);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_5a8);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_5c8);
      BigIntegerLibrary::BigInteger::operator-
                (&local_688,(BigInteger *)&y1.isNegative,(BigInteger *)&y3.isNegative);
      BigIntegerLibrary::BigInteger::operator*(&local_668,(BigInteger *)local_3e8,&local_688);
      BigIntegerLibrary::BigInteger::operator-(&local_648,&local_668,(BigInteger *)local_60);
      BigIntegerLibrary::BigInteger::operator*(&local_6a8,&this->p,&this->p);
      BigIntegerLibrary::BigInteger::operator+(&local_628,&local_648,&local_6a8);
      BigIntegerLibrary::BigInteger::operator%(&local_608,&local_628,&this->p);
      BigIntegerLibrary::BigInteger::operator=
                ((BigInteger *)
                 &algorithms.listOfPrimeDivisors.
                  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_608);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_608);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_628);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_6a8);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_648);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_668);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_688);
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_3e8);
    }
  }
  BigIntegerLibrary::BigInteger::BigInteger(&local_6c8,(BigInteger *)&y3.isNegative);
  BigIntegerLibrary::BigInteger::BigInteger
            (&local_6e8,
             (BigInteger *)
             &algorithms.listOfPrimeDivisors.
              super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  EllypticPoint(__return_storage_ptr__,&local_6c8,&local_6e8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_6e8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_6c8);
  Algorithms::~Algorithms((Algorithms *)&lambda.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger
            ((BigInteger *)
             &algorithms.listOfPrimeDivisors.
              super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&y3.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&x3.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&y2.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_60);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&y1.isNegative);
  return __return_storage_ptr__;
}

Assistant:

EllypticPoint EllypticPoint::operator+(const EllypticPoint& other) const {
    BigInteger x1 = x, y1 = y;
    BigInteger x2 = other.x, y2 = other.y;
    BigInteger x3(0), y3(0);
    Algorithms algorithms = Algorithms();
    if (x1 != x2 && y1 != y2) {
        BigInteger lambda = ((y2 - y1 + p) % p * algorithms.inverse((x2 - x1 + p) % p, p)) % p;
//        lambda = a;
        x3 = (lambda * lambda - x2 - x1 + p * p) % p;
        y3 = (lambda * (x1 - x3) - y1 + p * p) % p;
    } else if (x1 == x2 && y1 == y2) {
        BigInteger lambda = (x1 * x1 * 3 + a + p * p) % p * algorithms.inverse (y1 + y1, p) % p;
//        lambda = a;
        x3 = (lambda * lambda - x2 - x1 + p * p) % p;
        y3 = (lambda * (x1 - x3) - y1 + p * p) % p;
    } else {
//        cout << "Mda";
    }
    return EllypticPoint(x3, y3);
}